

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2sAnalyzer.cpp
# Opt level: O1

void __thiscall I2sAnalyzer::I2sAnalyzer(I2sAnalyzer *this)

{
  I2sAnalyzerSettings *this_00;
  
  Analyzer2::Analyzer2(&this->super_Analyzer2);
  *(undefined ***)this = &PTR__I2sAnalyzer_0010cca0;
  this_00 = (I2sAnalyzerSettings *)operator_new(0xb8);
  I2sAnalyzerSettings::I2sAnalyzerSettings(this_00);
  (this->mSettings)._M_ptr = this_00;
  (this->mResults)._M_ptr = (I2sAnalyzerResults *)0x0;
  this->mSimulationInitilized = false;
  I2sSimulationDataGenerator::I2sSimulationDataGenerator(&this->mSimulationDataGenerator);
  (this->mDataValidEdges).
  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mDataValidEdges).
  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mDataBits).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mDataValidEdges).
  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mDataBits).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mDataBits).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  Analyzer::SetAnalyzerSettings((AnalyzerSettings *)this);
  Analyzer::UseFrameV2();
  return;
}

Assistant:

I2sAnalyzer::I2sAnalyzer() : Analyzer2(), mSettings( new I2sAnalyzerSettings() ), mSimulationInitilized( false )
{
    SetAnalyzerSettings( mSettings.get() );
    UseFrameV2();
}